

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O0

void prsvgfr(prscxdef *ctx,toktldef *lcltab,uint *encfr)

{
  ushort uVar1;
  uint uVar2;
  uint *in_RDX;
  void *in_RSI;
  _func_void_void_ptr_toksdef_ptr *in_RDI;
  uint diff;
  uint ofs;
  emtcxdef *ec;
  undefined4 in_stack_ffffffffffffffdc;
  emtcxdef *ctx_00;
  
  if ((*(ushort *)(in_RDI + 0x80) & 2) != 0) {
    ctx_00 = *(emtcxdef **)(in_RDI + 0x28);
    emtres(ctx_00,(ushort)((uint)in_stack_ffffffffffffffdc >> 0x10));
    uVar1 = ctx_00->emtcxofs;
    ctx_00->emtcxofs = uVar1 + 1;
    ctx_00->emtcxptr[(int)(uint)uVar1] = 'O';
    uVar2 = (uint)ctx_00->emtcxofs;
    emtres(ctx_00,0);
    oswp2(ctx_00->emtcxptr + (int)(uint)ctx_00->emtcxofs,0);
    ctx_00->emtcxofs = ctx_00->emtcxofs + 2;
    emtres(ctx_00,(ushort)(uVar2 >> 0x10));
    oswp2(ctx_00->emtcxptr + (int)(uint)ctx_00->emtcxofs,*in_RDX);
    ctx_00->emtcxofs = ctx_00->emtcxofs + 2;
    toktleach(_diff,in_RDI,in_RSI);
    oswp2(ctx_00->emtcxptr + uVar2,*(ushort *)(*(long *)(in_RDI + 0x28) + 0x12) - uVar2);
    *in_RDX = uVar2;
  }
  return;
}

Assistant:

static void prsvgfr(prscxdef *ctx, toktldef *lcltab, uint *encfr)
{
    if (ctx->prscxflg & PRSCXFLCL)
    {
        emtcxdef *ec = ctx->prscxemt;
        uint      ofs;
        uint      diff;

        /* write the FRAME instruction and operand header */
        emtop(ec, OPCFRAME);
        ofs = ec->emtcxofs;          /* remember the location of the length */
        emtint2(ec, 0);           /* placeholder - we'll fill this in later */
        emtint2(ec, *encfr);                /* point to the enclosing frame */
        
        /* write out the symbols using the callback iterator */
        toktleach(&lcltab->toktlsc, prsvgf0, ctx);
        
        /* now write the length of the table back at the beginning */
        diff = ctx->prscxemt->emtcxofs - ofs;
        emtint2at(ec, diff, ofs);
        
        /* the new table is now the current frame */
        *encfr = ofs;
    }
}